

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ostream_logger.cpp
# Opt level: O2

Logger * __thiscall util::logging::Ostream_logger::do_output(Ostream_logger *this,Msg *msg)

{
  sp_counted_base *psVar1;
  M_Level MVar2;
  type pFVar3;
  type pbVar4;
  type pbVar5;
  long local_48;
  string fmtmsg;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> tout;
  
  MVar2 = Msg::getMsg_lvl(msg);
  if ((((MVar2 & (this->super_Logger).verb_lvl) != 0) &&
      (psVar1 = (this->outstream).pn.pi_, psVar1 != (sp_counted_base *)0x0)) &&
     (psVar1->use_count_ != 0)) {
    boost::shared_ptr<std::ostream>::shared_ptr<std::ostream>
              ((shared_ptr<std::ostream> *)((long)&fmtmsg.field_2 + 8),&this->outstream);
    pFVar3 = boost::shared_ptr<util::logging::Formatter>::operator->
                       (&(this->super_Logger).formatter);
    (*pFVar3->_vptr_Formatter[2])(&local_48,pFVar3,msg);
    pbVar4 = boost::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator->
                       ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)
                        ((long)&fmtmsg.field_2 + 8));
    std::ostream::write((char *)pbVar4,local_48);
    pbVar5 = boost::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator*
                       ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)
                        ((long)&fmtmsg.field_2 + 8));
    std::endl<char,std::char_traits<char>>((ostream *)pbVar5);
    std::__cxx11::string::~string((string *)&local_48);
    boost::detail::shared_count::~shared_count((shared_count *)&tout);
  }
  return &this->super_Logger;
}

Assistant:

Logger& Ostream_logger::do_output( const Msg& msg )
		{
			if((msg.getMsg_lvl() & verb_lvl) != 0 and (not outstream.expired()))
			{
				shared_ptr<std::ostream> tout = outstream.lock();

				std::string fmtmsg = formatter->do_formatting(msg);
				tout->write(fmtmsg.c_str(), fmtmsg.size());
				std::endl(*tout);
			}

			return *this;

		}